

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysdep.c
# Opt level: O0

void get_system_time(uuid_time_t *uuid_time)

{
  undefined1 local_20 [8];
  timeval tp;
  uuid_time_t *uuid_time_local;
  
  tp.tv_usec = (__suseconds_t)uuid_time;
  gettimeofday((timeval *)local_20,(__timezone_ptr_t)0x0);
  *(long *)tp.tv_usec = (long)local_20 * 10000000 + tp.tv_sec * 10 + 0x1b21dd213814000;
  return;
}

Assistant:

void get_system_time(uuid_time_t *uuid_time)
{
	struct timeval tp;

	gettimeofday(&tp, (struct timezone *)0);
	/* Offset between UUID formatted times and Unix formatted times.
	 * UUID UTC base time is October 15, 1582.
	 * Unix base time is January 1, 1970. */
	*uuid_time = (uuid_time_t)tp.tv_sec * 10000000 +
		     (uuid_time_t)tp.tv_usec * 10 + 0x01B21DD213814000L;
}